

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O0

Float __thiscall
pbrt::LightHandle::PDF_Li
          (LightHandle *this,LightSampleContext ctx,Vector3f wi,LightSamplingMode mode)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  anon_class_24_3_20c75c41 func;
  undefined4 in_ESI;
  undefined4 in_XMM0_Da;
  Float FVar3;
  undefined1 in_register_00001204 [12];
  undefined4 in_XMM1_Da;
  anon_class_24_3_20c75c41 pdf;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  auVar2._4_12_ = in_register_00001204;
  auVar2._0_4_ = in_XMM0_Da;
  uVar1 = vmovlpd_avx(auVar2);
  func._4_8_ = uVar1;
  func.ctx._0_4_ = in_stack_ffffffffffffffe0;
  func.wi._4_4_ = in_XMM1_Da;
  func.mode._0_4_ = in_stack_fffffffffffffff0;
  func.mode._4_4_ = (int)uVar1;
  FVar3 = TaggedPointer<pbrt::PointLight,pbrt::DistantLight,pbrt::ProjectionLight,pbrt::GoniometricLight,pbrt::SpotLight,pbrt::DiffuseAreaLight,pbrt::UniformInfiniteLight,pbrt::ImageInfiniteLight,pbrt::PortalImageInfiniteLight>
          ::
          Dispatch<pbrt::LightHandle::PDF_Li(pbrt::LightSampleContext,pbrt::Vector3<float>,pbrt::LightSamplingMode)const::_lambda(auto:1)_1_>
                    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
                      *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),func);
  return FVar3;
}

Assistant:

inline Float LightHandle::PDF_Li(LightSampleContext ctx, Vector3f wi,
                                 LightSamplingMode mode) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_Li(ctx, wi, mode); };
    return Dispatch(pdf);
}